

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

void __thiscall
testing::internal::OnCallSpec<int_(int)>::OnCallSpec
          (OnCallSpec<int_(int)> *this,char *a_file,int a_line,ArgumentMatcherTuple *matchers)

{
  ArgumentMatcherTuple *matchers_local;
  int a_line_local;
  char *a_file_local;
  OnCallSpec<int_(int)> *this_local;
  
  UntypedOnCallSpecBase::UntypedOnCallSpecBase(&this->super_UntypedOnCallSpecBase,a_file,a_line);
  std::tuple<testing::Matcher<int>_>::tuple(&this->matchers_,matchers);
  A<std::tuple<int>const&>();
  Action<int_(int)>::Action(&this->action_);
  return;
}

Assistant:

OnCallSpec(const char* a_file, int a_line,
             const ArgumentMatcherTuple& matchers)
      : UntypedOnCallSpecBase(a_file, a_line),
        matchers_(matchers),
        // By default, extra_matcher_ should match anything.  However,
        // we cannot initialize it with _ as that causes ambiguity between
        // Matcher's copy and move constructor for some argument types.
        extra_matcher_(A<const ArgumentTuple&>()) {}